

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::initiatorFixtureIncorrectNumInGroupCount_RejectedHelper::
initiatorFixtureIncorrectNumInGroupCount_RejectedHelper
          (initiatorFixtureIncorrectNumInGroupCount_RejectedHelper *this,TestDetails *details)

{
  TestDetails *details_local;
  initiatorFixtureIncorrectNumInGroupCount_RejectedHelper *this_local;
  
  initiatorFixture::initiatorFixture(&this->super_initiatorFixture);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder =
       (_func_int **)&PTR__initiatorFixtureIncorrectNumInGroupCount_RejectedHelper_004644b8;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application =
       (_func_int **)&PTR__initiatorFixtureIncorrectNumInGroupCount_RejectedHelper_00464510;
  this->m_details = details;
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, IncorrectNumInGroupCount_Rejected)
{
  startLoggedOn();

  FIX42::NewOrderSingle newOrderSingle = createNewOrderSingle( "ISLD", "TW", 2 );
  FIX::Group group1(FIELD::NoAllocs, FIELD::AllocAccount);
  group1.setField(AllocAccount("account"));
  newOrderSingle.addGroup(group1);
  newOrderSingle.setField(NoAllocs(2));

  object->next( newOrderSingle, UtcTimeStamp() );
  CHECK_EQUAL(1, toReject);
}